

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O2

void Fra_SmlInitializeGiven(Fra_Sml_t *p,Vec_Str_t *vSimInfo)

{
  long lVar1;
  uint *puVar2;
  char cVar3;
  int iVar4;
  ulong uVar5;
  void *pvVar6;
  long lVar7;
  int iVar8;
  Aig_Man_t *pAVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  int i;
  
  pAVar9 = p->pAig;
  uVar5 = (long)vSimInfo->nSize / (long)pAVar9->nObjs[2];
  if (pAVar9->nRegs != 0) {
    __assert_fail("Aig_ManRegNum(p->pAig) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraSim.c"
                  ,0x39b,"void Fra_SmlInitializeGiven(Fra_Sml_t *, Vec_Str_t *)");
  }
  if (vSimInfo->nSize % pAVar9->nObjs[2] != 0) {
    __assert_fail("Vec_StrSize(vSimInfo) % Aig_ManCiNum(p->pAig) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraSim.c"
                  ,0x39c,"void Fra_SmlInitializeGiven(Fra_Sml_t *, Vec_Str_t *)");
  }
  iVar10 = p->nWordsTotal * 0x20;
  iVar4 = (int)uVar5;
  if (iVar10 < iVar4) {
    __assert_fail("nPats <= nPatsPadded",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraSim.c"
                  ,0x39d,"void Fra_SmlInitializeGiven(Fra_Sml_t *, Vec_Str_t *)");
  }
  uVar12 = 0;
  uVar5 = uVar5 & 0xffffffff;
  if (iVar4 < 1) {
    uVar5 = uVar12;
  }
  while( true ) {
    i = (int)uVar12;
    if (pAVar9->vCis->nSize <= i) break;
    pvVar6 = Vec_PtrEntry(pAVar9->vCis,i);
    iVar8 = p->nWordsTotal;
    lVar1 = (long)(*(int *)((long)pvVar6 + 0x24) * iVar8) * 4;
    for (lVar7 = 0; lVar7 < iVar8; lVar7 = lVar7 + 1) {
      *(undefined4 *)((long)&p[1].pAig + lVar7 * 4 + lVar1) = 0;
      iVar8 = p->nWordsTotal;
    }
    for (uVar11 = 0; uVar12 = uVar5, (uint)uVar5 != uVar11; uVar11 = uVar11 + 1) {
      cVar3 = Vec_StrEntry(vSimInfo,p->pAig->nObjs[2] * uVar11 + i);
      if (cVar3 != '\0') {
        puVar2 = (uint *)((long)&p[1].pAig + (ulong)(uVar11 >> 5) * 4 + lVar1);
        *puVar2 = *puVar2 | 1 << ((byte)uVar11 & 0x1f);
      }
    }
    for (; (int)uVar12 < iVar10; uVar12 = (ulong)((int)uVar12 + 1)) {
      cVar3 = Vec_StrEntry(vSimInfo,p->pAig->nObjs[2] * (iVar4 + -1) + i);
      if (cVar3 != '\0') {
        puVar2 = (uint *)((long)&p[1].pAig + (uVar12 >> 5) * 4 + lVar1);
        *puVar2 = *puVar2 | 1 << ((byte)uVar12 & 0x1f);
      }
    }
    uVar12 = (ulong)(i + 1);
    pAVar9 = p->pAig;
  }
  return;
}

Assistant:

void Fra_SmlInitializeGiven( Fra_Sml_t * p, Vec_Str_t * vSimInfo )
{
    Aig_Obj_t * pObj;
    unsigned * pSims;
    int i, k, nPats = Vec_StrSize(vSimInfo) / Aig_ManCiNum(p->pAig);
    int nPatsPadded = p->nWordsTotal * 32;
    assert( Aig_ManRegNum(p->pAig) == 0 );
    assert( Vec_StrSize(vSimInfo) % Aig_ManCiNum(p->pAig) == 0 );
    assert( nPats <= nPatsPadded );
    Aig_ManForEachCi( p->pAig, pObj, i )
    {
        pSims = Fra_ObjSim( p, pObj->Id );
        // clean data
        for ( k = 0; k < p->nWordsTotal; k++ )
            pSims[k] = 0;
        // load patterns
        for ( k = 0; k < nPats; k++ )
            if ( Vec_StrEntry(vSimInfo, k * Aig_ManCiNum(p->pAig) + i) )
                Abc_InfoSetBit( pSims, k );
        // pad the remaining bits with the value of the last pattern
        for ( ; k < nPatsPadded; k++ )
            if ( Vec_StrEntry(vSimInfo, (nPats-1) * Aig_ManCiNum(p->pAig) + i) )
                Abc_InfoSetBit( pSims, k );
    }
}